

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::GetNavInputAmount2d
                 (ImGuiNavDirSourceFlags dir_sources,ImGuiInputReadMode mode,float slow_factor,
                 float fast_factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar9 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar10 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar11 [64];
  ImVec2 IVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  undefined1 local_58 [8];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  IVar12.x = 0.0;
  IVar12.y = 0.0;
  if ((dir_sources & 1U) != 0) {
    local_58._0_4_ = GetNavInputAmount(0x12,mode);
    local_58._4_4_ = extraout_XMM0_Db;
    uStack_50 = extraout_XMM0_Dc;
    uStack_4c = extraout_XMM0_Dd;
    fVar6 = GetNavInputAmount(0x11,mode);
    fVar7 = GetNavInputAmount(0x14,mode);
    auVar9._0_4_ = GetNavInputAmount(0x13,mode);
    auVar9._4_60_ = extraout_var;
    auVar1 = vinsertps_avx(_local_58,ZEXT416((uint)fVar7),0x10);
    auVar2._4_4_ = extraout_XMM0_Db_00;
    auVar2._0_4_ = fVar6;
    auVar2._8_4_ = extraout_XMM0_Dc_00;
    auVar2._12_4_ = extraout_XMM0_Dd_00;
    auVar2 = vinsertps_avx(auVar2,auVar9._0_16_,0x10);
    auVar1 = vsubps_avx(auVar1,auVar2);
    IVar12.x = auVar1._0_4_ + 0.0;
    IVar12.y = auVar1._4_4_ + 0.0;
  }
  if ((dir_sources & 2U) != 0) {
    fVar6 = GetNavInputAmount(5,mode);
    fVar7 = GetNavInputAmount(4,mode);
    fVar8 = GetNavInputAmount(7,mode);
    auVar10._0_4_ = GetNavInputAmount(6,mode);
    auVar10._4_60_ = extraout_var_00;
    local_58._0_4_ = IVar12.x;
    local_58._4_4_ = IVar12.y;
    auVar1._4_4_ = extraout_XMM0_Db_01;
    auVar1._0_4_ = fVar6;
    auVar1._8_4_ = extraout_XMM0_Dc_01;
    auVar1._12_4_ = extraout_XMM0_Dd_01;
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar8),0x10);
    auVar3._4_4_ = extraout_XMM0_Db_02;
    auVar3._0_4_ = fVar7;
    auVar3._8_4_ = extraout_XMM0_Dc_02;
    auVar3._12_4_ = extraout_XMM0_Dd_02;
    auVar2 = vinsertps_avx(auVar3,auVar10._0_16_,0x10);
    auVar1 = vsubps_avx(auVar1,auVar2);
    IVar12.x = (float)local_58._0_4_ + auVar1._0_4_;
    IVar12.y = (float)local_58._4_4_ + auVar1._4_4_;
  }
  if ((dir_sources & 4U) != 0) {
    fVar6 = GetNavInputAmount(9,mode);
    fVar7 = GetNavInputAmount(8,mode);
    fVar8 = GetNavInputAmount(0xb,mode);
    auVar11._0_4_ = GetNavInputAmount(10,mode);
    auVar11._4_60_ = extraout_var_01;
    local_58._0_4_ = IVar12.x;
    local_58._4_4_ = IVar12.y;
    auVar5._4_4_ = extraout_XMM0_Db_03;
    auVar5._0_4_ = fVar6;
    auVar5._8_4_ = extraout_XMM0_Dc_03;
    auVar5._12_4_ = extraout_XMM0_Dd_03;
    auVar1 = vinsertps_avx(auVar5,ZEXT416((uint)fVar8),0x10);
    auVar4._4_4_ = extraout_XMM0_Db_04;
    auVar4._0_4_ = fVar7;
    auVar4._8_4_ = extraout_XMM0_Dc_04;
    auVar4._12_4_ = extraout_XMM0_Dd_04;
    auVar2 = vinsertps_avx(auVar4,auVar11._0_16_,0x10);
    auVar1 = vsubps_avx(auVar1,auVar2);
    IVar12.x = (float)local_58._0_4_ + auVar1._0_4_;
    IVar12.y = (float)local_58._4_4_ + auVar1._4_4_;
  }
  IVar13 = IVar12;
  if (((slow_factor != 0.0) || (NAN(slow_factor))) && (0.0 < (GImGui->IO).NavInputs[0xe])) {
    IVar13.x = IVar12.x * slow_factor;
    IVar13.y = IVar12.y * slow_factor;
  }
  IVar14 = IVar13;
  if (((fast_factor != 0.0) || (NAN(fast_factor))) && (0.0 < (GImGui->IO).NavInputs[0xf])) {
    IVar14.x = IVar13.x * fast_factor;
    IVar14.y = IVar13.y * fast_factor;
  }
  return IVar14;
}

Assistant:

ImVec2 ImGui::GetNavInputAmount2d(ImGuiNavDirSourceFlags dir_sources, ImGuiInputReadMode mode, float slow_factor, float fast_factor)
{
    ImVec2 delta(0.0f, 0.0f);
    if (dir_sources & ImGuiNavDirSourceFlags_Keyboard)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_KeyRight_, mode)   - GetNavInputAmount(ImGuiNavInput_KeyLeft_,   mode), GetNavInputAmount(ImGuiNavInput_KeyDown_,   mode) - GetNavInputAmount(ImGuiNavInput_KeyUp_,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadDPad)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_DpadRight, mode)   - GetNavInputAmount(ImGuiNavInput_DpadLeft,   mode), GetNavInputAmount(ImGuiNavInput_DpadDown,   mode) - GetNavInputAmount(ImGuiNavInput_DpadUp,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadLStick)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_LStickRight, mode) - GetNavInputAmount(ImGuiNavInput_LStickLeft, mode), GetNavInputAmount(ImGuiNavInput_LStickDown, mode) - GetNavInputAmount(ImGuiNavInput_LStickUp, mode));
    if (slow_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakSlow))
        delta *= slow_factor;
    if (fast_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakFast))
        delta *= fast_factor;
    return delta;
}